

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_sha256.c
# Opt level: O0

int tc_sha256_final(uint8_t *digest,TCSha256State_t s)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  uint local_24;
  uint t;
  uint i;
  TCSha256State_t s_local;
  uint8_t *digest_local;
  
  if ((digest == (uint8_t *)0x0) || (s == (TCSha256State_t)0x0)) {
    printf("tc_sha256_final failed, input sanity check.\n");
    digest_local._4_4_ = 0;
  }
  else {
    s->bits_hashed = s->leftover_offset * 8 + s->bits_hashed;
    sVar2 = s->leftover_offset;
    s->leftover_offset = sVar2 + 1;
    s->leftover[sVar2] = 0x80;
    if (0x38 < s->leftover_offset) {
      _set(s->leftover + s->leftover_offset,'\0',0x40 - (int)s->leftover_offset);
      compress(s->iv,s->leftover);
      s->leftover_offset = 0;
    }
    _set(s->leftover + s->leftover_offset,'\0',0x38 - (int)s->leftover_offset);
    s->leftover[0x3f] = (uint8_t)s->bits_hashed;
    s->leftover[0x3e] = (uint8_t)(s->bits_hashed >> 8);
    s->leftover[0x3d] = (uint8_t)(s->bits_hashed >> 0x10);
    s->leftover[0x3c] = (uint8_t)(s->bits_hashed >> 0x18);
    s->leftover[0x3b] = (uint8_t)(s->bits_hashed >> 0x20);
    s->leftover[0x3a] = (uint8_t)(s->bits_hashed >> 0x28);
    s->leftover[0x39] = (uint8_t)(s->bits_hashed >> 0x30);
    s->leftover[0x38] = (uint8_t)(s->bits_hashed >> 0x38);
    compress(s->iv,s->leftover);
    s_local = (TCSha256State_t)digest;
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      uVar1 = s->iv[local_24];
      *(char *)s_local->iv = (char)(uVar1 >> 0x18);
      *(char *)((long)s_local->iv + 1) = (char)(uVar1 >> 0x10);
      puVar3 = s_local->iv;
      *(char *)((long)s_local->iv + 2) = (char)(uVar1 >> 8);
      s_local = (TCSha256State_t)(s_local->iv + 1);
      *(char *)((long)puVar3 + 3) = (char)uVar1;
    }
    _set(s,'\0',0x70);
    digest_local._4_4_ = 1;
  }
  return digest_local._4_4_;
}

Assistant:

int tc_sha256_final(uint8_t *digest, TCSha256State_t s)
{
	unsigned int i;

	/* input sanity check: */
	if (digest == (uint8_t *) 0 ||
	    s == (TCSha256State_t) 0) {
                printf("tc_sha256_final failed, input sanity check.\n");
		return TC_CRYPTO_FAIL;
	}

	s->bits_hashed += (s->leftover_offset << 3);

	s->leftover[s->leftover_offset++] = 0x80; /* always room for one byte */
	if (s->leftover_offset > (sizeof(s->leftover) - 8)) {
		/* there is not room for all the padding in this block */
		_set(s->leftover + s->leftover_offset, 0x00,
		     sizeof(s->leftover) - s->leftover_offset);
		compress(s->iv, s->leftover);
		s->leftover_offset = 0;
	}

	/* add the padding and the length in big-Endian format */
	_set(s->leftover + s->leftover_offset, 0x00,
	     sizeof(s->leftover) - 8 - s->leftover_offset);
	s->leftover[sizeof(s->leftover) - 1] = (uint8_t)(s->bits_hashed);
	s->leftover[sizeof(s->leftover) - 2] = (uint8_t)(s->bits_hashed >> 8);
	s->leftover[sizeof(s->leftover) - 3] = (uint8_t)(s->bits_hashed >> 16);
	s->leftover[sizeof(s->leftover) - 4] = (uint8_t)(s->bits_hashed >> 24);
	s->leftover[sizeof(s->leftover) - 5] = (uint8_t)(s->bits_hashed >> 32);
	s->leftover[sizeof(s->leftover) - 6] = (uint8_t)(s->bits_hashed >> 40);
	s->leftover[sizeof(s->leftover) - 7] = (uint8_t)(s->bits_hashed >> 48);
	s->leftover[sizeof(s->leftover) - 8] = (uint8_t)(s->bits_hashed >> 56);

	/* hash the padding and length */
	compress(s->iv, s->leftover);

	/* copy the iv out to digest */
	for (i = 0; i < TC_SHA256_STATE_BLOCKS; ++i) {
		unsigned int t = *((unsigned int *) &s->iv[i]);
		*digest++ = (uint8_t)(t >> 24);
		*digest++ = (uint8_t)(t >> 16);
		*digest++ = (uint8_t)(t >> 8);
		*digest++ = (uint8_t)(t);
	}

	/* destroy the current state */
	_set(s, 0, sizeof(*s));

	return TC_CRYPTO_SUCCESS;
}